

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Roller.cxx
# Opt level: O2

int __thiscall Fl_Roller::handle(Fl_Roller *this,int event)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double dVar5;
  
  bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  if ((bVar1 & 1) == 0) {
    piVar4 = &Fl::e_y;
  }
  else {
    piVar4 = &Fl::e_x;
  }
  if (7 < event - 1U) {
    return 0;
  }
  iVar2 = *piVar4;
  switch(event) {
  case 1:
    iVar3 = Fl::visible_focus();
    if (iVar3 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    handle::ipos = iVar2;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 5:
    dVar5 = Fl_Valuator::increment
                      (&this->super_Fl_Valuator,(this->super_Fl_Valuator).previous_value_,
                       iVar2 - handle::ipos);
    dVar5 = Fl_Valuator::round(&this->super_Fl_Valuator,dVar5);
    goto LAB_001c3c00;
  case 6:
  case 7:
    iVar2 = Fl::visible_focus();
    if (iVar2 == 0) {
      return 0;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    break;
  case 8:
    iVar2 = 0;
    switch(Fl::e_keysym) {
    case 0xff51:
      if ((bVar1 & 1) == 0) {
        return 0;
      }
      break;
    case 0xff52:
      if ((bVar1 & 1) != 0) {
        return 0;
      }
      break;
    case 0xff53:
      if ((bVar1 & 1) == 0) {
        return 0;
      }
      goto LAB_001c3c87;
    case 0xff54:
      if ((bVar1 & 1) != 0) {
        return 0;
      }
LAB_001c3c87:
      iVar2 = 1;
      dVar5 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,1);
      dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
    default:
      goto switchD_001c3c35_default;
    }
    dVar5 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,-1);
LAB_001c3c00:
    dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
  }
  iVar2 = 1;
switchD_001c3c35_default:
  return iVar2;
}

Assistant:

int Fl_Roller::handle(int event) {
  static int ipos;
  int newpos = horizontal() ? Fl::event_x() : Fl::event_y();
  switch (event) {
  case FL_PUSH:
    if (Fl::visible_focus()) {
      Fl::focus(this);
      redraw();
    }
    handle_push();
    ipos = newpos;
    return 1;
  case FL_DRAG:
    handle_drag(clamp(round(increment(previous_value(),newpos-ipos))));
    return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD :
    switch (Fl::event_key()) {
      case FL_Up:
        if (horizontal()) return 0;
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Down:
        if (horizontal()) return 0;
	handle_drag(clamp(increment(value(),1)));
	return 1;
      case FL_Left:
        if (!horizontal()) return 0;
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Right:
        if (!horizontal()) return 0;
	handle_drag(clamp(increment(value(),1)));
	return 1;
      default:
        return 0;
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}